

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O0

string * format_json_value(string *field,string *value)

{
  field_type fVar1;
  string *in_RDX;
  string *in_RDI;
  string *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> local_65 [5];
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  string local_38 [32];
  string *local_18;
  
  local_18 = in_RDX;
  fVar1 = test::get_field_type(in_stack_ffffffffffffff68);
  if (fVar1 == STRING) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffffa8;
    escape_json((string *)in_stack_ffffffffffffffb8);
    std::operator+((char *)__lhs,in_stack_ffffffffffffff70);
    std::operator+(__lhs,(char *)in_stack_ffffffffffffff70);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  }
  else if (fVar1 == BOOL) {
    std::operator==(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::allocator<char>::~allocator(local_65);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,local_18);
  }
  return in_RDI;
}

Assistant:

static std::string format_json_value(const std::string & field, const std::string & value) {
    switch (test::get_field_type(field)) {
        case test::STRING:
            return "\"" + escape_json(value) + "\"";
        case test::BOOL:
            return value == "0" ? "false" : "true";
        default:
            return value;
    }
}